

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::integer_parser<int>(string *text,int *value)

{
  char cVar1;
  int iVar2;
  uint value_00;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  IntegerDesc int_desc;
  
  parser_tool::SplitInteger(&int_desc,text);
  iVar2 = 10;
  if (int_desc.base._M_string_length != 0) {
    iVar2 = 0x10;
  }
  value_00 = 0;
  for (sVar5 = 0; int_desc.value._M_string_length != sVar5; sVar5 = sVar5 + 1) {
    cVar1 = int_desc.value._M_dataplus._M_p[sVar5];
    iVar4 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar4 = iVar4 + -0x30;
    }
    else if ((int_desc.base._M_string_length == 0) || (5 < (byte)(cVar1 + 0x9fU))) {
      if ((int_desc.base._M_string_length == 0) || (5 < (byte)(cVar1 + 0xbfU))) {
        iVar4 = 0;
        throw_or_mimic<cxxopts::argument_incorrect_type>(text);
      }
      else {
        iVar4 = iVar4 + -0x37;
      }
    }
    else {
      iVar4 = iVar4 + -0x57;
    }
    uVar3 = value_00 * iVar2 + iVar4;
    if (uVar3 < value_00) {
      throw_or_mimic<cxxopts::argument_incorrect_type>(text);
    }
    value_00 = uVar3;
  }
  detail::check_signed_range<int,unsigned_int>
            (int_desc.negative._M_string_length != 0,value_00,text);
  uVar3 = -value_00;
  if (int_desc.negative._M_string_length == 0) {
    uVar3 = value_00;
  }
  *value = uVar3;
  parser_tool::IntegerDesc::~IntegerDesc(&int_desc);
  return;
}

Assistant:

void
    integer_parser(const std::string& text, T& value)
    {
      parser_tool::IntegerDesc int_desc = parser_tool::SplitInteger(text);

      using US = typename std::make_unsigned<T>::type;
      constexpr bool is_signed = std::numeric_limits<T>::is_signed;

      const bool          negative    = int_desc.negative.length() > 0;
      const uint8_t       base        = int_desc.base.length() > 0 ? 16 : 10;
      const std::string & value_match = int_desc.value;

      US result = 0;

      for (char ch : value_match)
      {
        US digit = 0;

        if (ch >= '0' && ch <= '9')
        {
          digit = static_cast<US>(ch - '0');
        }
        else if (base == 16 && ch >= 'a' && ch <= 'f')
        {
          digit = static_cast<US>(ch - 'a' + 10);
        }
        else if (base == 16 && ch >= 'A' && ch <= 'F')
        {
          digit = static_cast<US>(ch - 'A' + 10);
        }
        else
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        const US next = static_cast<US>(result * base + digit);
        if (result > next)
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        result = next;
      }

      detail::check_signed_range<T>(negative, result, text);

      if (negative)
      {
        checked_negate<T>(value, result, text, std::integral_constant<bool, is_signed>());
      }
      else
      {
        value = static_cast<T>(result);
      }
    }